

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_comparison_unit.c
# Opt level: O0

void container_checked_add(container_t *container,uint16_t val,uint8_t typecode)

{
  container_t *pcVar1;
  undefined1 in_DL;
  undefined2 in_SI;
  uint8_t *in_RDI;
  container_t *new_container;
  undefined5 in_stack_00000008;
  uint8_t new_type;
  int line;
  undefined5 in_stack_fffffffffffffff0;
  
  pcVar1 = container_add((container_t *)CONCAT26(val,CONCAT15(typecode,in_stack_00000008)),
                         new_container._6_2_,new_container._5_1_,in_RDI);
  line = (int)((ulong)pcVar1 >> 0x20);
  _assert_int_equal(CONCAT26(new_container._6_2_,CONCAT15(new_container._5_1_,new_container._0_5_)),
                    (unsigned_long)in_RDI,
                    (char *)CONCAT26(in_SI,CONCAT15(in_DL,in_stack_fffffffffffffff0)),line);
  _assert_true(CONCAT26(new_container._6_2_,CONCAT15(new_container._5_1_,new_container._0_5_)),
               (char *)in_RDI,(char *)CONCAT26(in_SI,CONCAT15(in_DL,in_stack_fffffffffffffff0)),line
              );
  return;
}

Assistant:

static inline void container_checked_add(container_t *container, uint16_t val,
                                         uint8_t typecode) {
    uint8_t new_type;
    container_t *new_container =
        container_add(container, val, typecode, &new_type);
    assert_int_equal(typecode, new_type);
    assert_true(container == new_container);
}